

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

void __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::Capture
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,RestorePoint *restorePoint,
          uint functionIdIncrement,size_t lengthDecr)

{
  Type TVar1;
  charcount_t cVar2;
  
  cVar2 = IchMinTok(this);
  restorePoint->m_ichMinTok = cVar2;
  cVar2 = IchMinLine(this);
  restorePoint->m_ichMinLine = cVar2;
  TVar1 = this->m_cMinLineMultiUnits;
  restorePoint->m_cMinTokMultiUnits = this->m_cMinTokMultiUnits;
  restorePoint->m_cMinLineMultiUnits = TVar1;
  restorePoint->m_line = this->m_line;
  restorePoint->m_fHadEol = this->m_fHadEol;
  restorePoint->functionIdIncrement = functionIdIncrement;
  restorePoint->lengthDecr = lengthDecr;
  restorePoint->m_cMultiUnits = (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
  return;
}

Assistant:

void Scanner<EncodingPolicy>::Capture(_Out_ RestorePoint* restorePoint, uint functionIdIncrement, size_t lengthDecr)
{
    restorePoint->m_ichMinTok = this->IchMinTok();
    restorePoint->m_ichMinLine = this->IchMinLine();
    restorePoint->m_cMinTokMultiUnits = this->m_cMinTokMultiUnits;
    restorePoint->m_cMinLineMultiUnits = this->m_cMinLineMultiUnits;
    restorePoint->m_line = this->m_line;
    restorePoint->m_fHadEol = this->m_fHadEol;

    restorePoint->functionIdIncrement = functionIdIncrement;
    restorePoint->lengthDecr = lengthDecr;

#ifdef DEBUG
    restorePoint->m_cMultiUnits = this->m_cMultiUnits;
#endif
}